

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O3

const_reference __thiscall immutable::vector<int,_false,_6>::front(vector<int,_false,_6> *this)

{
  rrb<int,_false,_6> *prVar1;
  long lVar2;
  uint uVar3;
  uint32_t uVar4;
  char *__function;
  leaf_node<int,_false> *plVar5;
  uint uVar6;
  uint uVar7;
  long *plVar8;
  
  prVar1 = (this->_impl).ptr;
  if (prVar1 == (rrb<int,_false,_6> *)0x0) {
    __function = 
    "T *immutable::ref<immutable::rrb<int, false, 6>>::operator->() const [T = immutable::rrb<int, false, 6>]"
    ;
LAB_00144cf8:
    __assert_fail("ptr != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/../immutable/rrb.h"
                  ,0x71a,__function);
  }
  if (prVar1->cnt == 0) {
    __assert_fail("index < rrb->cnt",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/../immutable/rrb.h"
                  ,0x7c3,
                  "const T &immutable::rrb_nth(const ref<rrb<T, atomic_ref_counting, N>> &, uint32_t) [T = int, atomic_ref_counting = false, N = 6]"
                 );
  }
  if (prVar1->cnt == prVar1->tail_len) {
    plVar5 = (prVar1->tail).ptr;
    if (plVar5 == (leaf_node<int,_false> *)0x0) {
      __function = 
      "T *immutable::ref<immutable::rrb_details::leaf_node<int, false>>::operator->() const [T = immutable::rrb_details::leaf_node<int, false>]"
      ;
      goto LAB_00144cf8;
    }
    uVar6 = 0;
  }
  else {
    uVar4 = prVar1->shift;
    plVar5 = (leaf_node<int,_false> *)(prVar1->root).ptr;
    uVar3 = 0;
    uVar6 = 0;
    if (uVar4 != 0) {
      do {
        uVar6 = uVar3 >> ((byte)uVar4 & 0x1f);
        if ((long *)plVar5->child == (long *)0x0) {
          plVar8 = (long *)((ulong)((uVar6 & 0x3f) << 3) + *(long *)(plVar5 + 1));
        }
        else {
          lVar2 = *(long *)plVar5->child;
          do {
            uVar7 = uVar6;
            uVar6 = uVar7 + 1;
          } while (*(uint *)(lVar2 + (ulong)uVar7 * 4) <= uVar3);
          if (uVar7 + 1 != 1) {
            uVar3 = uVar3 - *(int *)(lVar2 + (ulong)(uVar7 - 1) * 4);
          }
          plVar8 = (long *)((ulong)uVar7 * 8 + *(long *)(plVar5 + 1));
        }
        plVar5 = (leaf_node<int,_false> *)*plVar8;
        uVar4 = uVar4 - 6;
      } while (uVar4 != 0);
      uVar6 = uVar3 & 0x3f;
    }
  }
  return (const_reference)((ulong)(uVar6 << 2) + (long)plVar5->child);
}

Assistant:

const_reference front() const
        {
        return rrb_nth(_impl, 0);
        }